

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

void __thiscall CDBBatch::Erase<unsigned_char>(CDBBatch *this,uchar *key)

{
  long lVar1;
  DataStream *in_RSI;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> in_stack_00000000;
  DataStream *other;
  CDBBatch *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = (DataStream *)
          &(in_RDI->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  DataStream::reserve(in_RDI,0x399b4c);
  DataStream::operator<<(in_RSI,(uchar *)other);
  Span<const_std::byte>::Span<DataStream>((Span<const_std::byte> *)in_RSI,other,in_RDI);
  EraseImpl(in_stack_ffffffffffffffe8,in_stack_00000000);
  DataStream::clear(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Erase(const K& key)
    {
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey << key;
        EraseImpl(ssKey);
        ssKey.clear();
    }